

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
kj::Maybe<kj::_::Tuple<kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool>_>::
Maybe(Maybe<kj::_::Tuple<kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool>_>
      *this,Maybe<kj::_::Tuple<kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool>_>
            *other)

{
  NullableValue<kj::_::Tuple<kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool>_>
  *other_00;
  Maybe<kj::_::Tuple<kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool>_>
  *other_local;
  Maybe<kj::_::Tuple<kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool>_>
  *this_local;
  
  other_00 = mv<kj::_::NullableValue<kj::_::Tuple<kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>>,bool,bool>>>
                       (&other->ptr);
  kj::_::
  NullableValue<kj::_::Tuple<kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool>_>
  ::NullableValue(&this->ptr,other_00);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }